

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O3

bool dxil_spv::analyze_ags_wmma_store(Impl *impl,StoreInst *store)

{
  ValueKind VVar1;
  uint uVar2;
  iterator iVar3;
  Value *pVVar4;
  Instruction *this;
  key_type this_00;
  LoggingCallback p_Var5;
  void *pvVar6;
  mapped_type *pmVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  SplitScaleBias split;
  AllocaInst *alloca;
  char buffer [4096];
  SplitScaleBias local_1048;
  key_type local_1030;
  undefined8 local_1028;
  char acStack_1020 [5];
  undefined2 uStack_101b;
  char cStack_1019;
  undefined5 uStack_1018;
  undefined2 uStack_1013;
  undefined1 uStack_1011;
  undefined4 uStack_1010;
  undefined1 uStack_100c;
  undefined2 uStack_100b;
  undefined1 uStack_1009;
  undefined4 uStack_1008;
  undefined1 uStack_1004;
  undefined2 uStack_1003;
  undefined5 uStack_1001;
  undefined1 uStack_ffc;
  undefined2 uStack_ffb;
  
  local_1028 = LLVMBC::Instruction::getOperand(&store->super_Instruction,0);
  iVar3 = std::
          _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(impl->ags).coopmat_component_mapping._M_h,(key_type *)&local_1028);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
      ._M_cur == (__node_type *)0x0) {
    return true;
  }
  pVVar4 = LLVMBC::Instruction::getOperand(&store->super_Instruction,1);
  if (pVVar4 == (Value *)0x0) {
LAB_001798d4:
    p_Var5 = get_thread_log_callback();
    if (p_Var5 == (LoggingCallback)0x0) {
      analyze_ags_wmma_store();
      return false;
    }
    uStack_1008 = 0x756f6874;
    uStack_1004 = 0x74;
    uStack_1003 = 0x4720;
    uStack_1001 = 0xa2e5045;
    uStack_1018 = 0x4d4d572061;
    uStack_1013 = 0x2041;
    uStack_1011 = 0x6d;
    uStack_1010 = 0x69727461;
    uStack_100c = 0x78;
    uStack_100b = 0x7720;
    uStack_1009 = 0x69;
    uVar8._0_1_ = 'T';
    uVar8._1_1_ = 'r';
    uVar8._2_1_ = 'y';
    uVar8._3_1_ = 'i';
    uVar9._0_1_ = 'n';
    uVar9._1_1_ = 'g';
    uVar9._2_1_ = ' ';
    uVar9._3_1_ = 't';
    acStack_1020[0] = 'o';
    acStack_1020[1] = ' ';
    acStack_1020[2] = 's';
    acStack_1020[3] = 't';
    uVar10._0_1_ = 'o';
    uVar10._1_1_ = 'r';
    uVar10._2_1_ = 'e';
    uVar10._3_1_ = ' ';
  }
  else {
    this = (Instruction *)LLVMBC::Internal::resolve_proxy(pVVar4);
    VVar1 = LLVMBC::Value::get_value_kind((Value *)this);
    if (VVar1 != GetElementPtr) goto LAB_001798d4;
    pVVar4 = LLVMBC::Instruction::getOperand(this,0);
    if (pVVar4 == (Value *)0x0) {
LAB_0017989d:
      p_Var5 = get_thread_log_callback();
      if (p_Var5 == (LoggingCallback)0x0) {
        analyze_ags_wmma_store();
        return false;
      }
      uStack_1008 = 0x6f6e2067;
      uStack_1004 = 0x74;
      uStack_1003 = 0x4120;
      uStack_1001 = 0x61636f6c6c;
      uStack_ffc = 0x2e;
      uStack_ffb = 10;
      uStack_1018 = 0x20414d4d57;
      uStack_1013 = 0x6f74;
      uStack_1011 = 0x20;
      uStack_1010 = 0x656d6f73;
      uStack_100c = 0x74;
      uStack_100b = 0x6968;
      uStack_1009 = 0x6e;
      uVar8._0_1_ = 'T';
      uVar8._1_1_ = 'r';
      uVar8._2_1_ = 'y';
      uVar8._3_1_ = 'i';
      uVar9._0_1_ = 'n';
      uVar9._1_1_ = 'g';
      uVar9._2_1_ = ' ';
      uVar9._3_1_ = 't';
      acStack_1020[0] = 'o';
      acStack_1020[1] = ' ';
      acStack_1020[2] = 's';
      acStack_1020[3] = 't';
      uVar10._0_1_ = 'o';
      uVar10._1_1_ = 'r';
      uVar10._2_1_ = 'e';
      uVar10._3_1_ = ' ';
    }
    else {
      this_00 = (key_type)LLVMBC::Internal::resolve_proxy(pVVar4);
      VVar1 = LLVMBC::Value::get_value_kind((Value *)this_00);
      if ((VVar1 != Alloca) ||
         (local_1030 = this_00, uVar2 = LLVMBC::Instruction::getNumOperands(this), uVar2 < 3))
      goto LAB_0017989d;
      pVVar4 = LLVMBC::Instruction::getOperand(this,2);
      split_index_scale_bias(&local_1048,pVVar4);
      if (local_1048.stride == 0) {
        return false;
      }
      pmVar7 = std::__detail::
               _Map_base<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaAGSForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->alloca_ags_tracking,&local_1030);
      if ((pmVar7->override_element_stride != 0) &&
         (local_1048.stride != 0xffffffff && pmVar7->override_element_stride != local_1048.stride))
      {
        p_Var5 = get_thread_log_callback();
        if (p_Var5 == (LoggingCallback)0x0) {
          analyze_ags_wmma_store();
          return false;
        }
        local_1028 = (key_type)0x686374616d73694d;
        builtin_strncpy(acStack_1020," WMMA",5);
        uStack_101b = 0x7320;
        cStack_1019 = 't';
        uStack_1018 = 0x2e65646972;
        uStack_1013 = 10;
        goto LAB_0017990d;
      }
      if ((pmVar7->override_element_type != 0) &&
         (pmVar7->override_element_type !=
          *(Id *)((long)iVar3.
                        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                        ._M_cur + 0x10))) {
        p_Var5 = get_thread_log_callback();
        if (p_Var5 == (LoggingCallback)0x0) {
          analyze_ags_wmma_store();
          return false;
        }
        local_1028 = (key_type)0x686374616d73694d;
        builtin_strncpy(acStack_1020," WMMA",5);
        uStack_101b = 0x7420;
        cStack_1019 = 'y';
        uStack_1018 = 0xa2e6570;
        goto LAB_0017990d;
      }
      if (local_1048.stride == 0xffffffff) {
        pmVar7->override_element_stride = 8;
        local_1048.stride = 8;
        local_1048.elem = local_1048.elem & 7;
      }
      if (local_1048.elem ==
          *(uint *)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                          ._M_cur + 0x14)) {
        pmVar7->override_element_stride = local_1048.stride;
        pmVar7->override_element_type =
             *(Id *)((long)iVar3.
                           super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                           ._M_cur + 0x10);
        return true;
      }
      p_Var5 = get_thread_log_callback();
      if (p_Var5 == (LoggingCallback)0x0) {
        analyze_ags_wmma_store();
        return false;
      }
      uStack_1008 = 0x414d4d57;
      uStack_1004 = 0x20;
      uStack_1003 = 0x7473;
      uStack_1001 = 0xa2e65726f;
      uStack_ffc = 0;
      uStack_1018 = 0x20746e656e;
      uStack_1013 = 0x616d;
      uStack_1011 = 0x70;
      uStack_1010 = 0x676e6970;
      uStack_100c = 0x20;
      uStack_100b = 0x6e69;
      uStack_1009 = 0x20;
      uVar8._0_1_ = 'U';
      uVar8._1_1_ = 'n';
      uVar8._2_1_ = 'e';
      uVar8._3_1_ = 'x';
      uVar9._0_1_ = 'p';
      uVar9._1_1_ = 'e';
      uVar9._2_1_ = 'c';
      uVar9._3_1_ = 't';
      acStack_1020[0] = 'e';
      acStack_1020[1] = 'd';
      acStack_1020[2] = ' ';
      acStack_1020[3] = 'c';
      uVar10._0_1_ = 'o';
      uVar10._1_1_ = 'm';
      uVar10._2_1_ = 'p';
      uVar10._3_1_ = 'o';
    }
  }
  local_1028 = (key_type)CONCAT44(uVar9,uVar8);
  acStack_1020[4] = (char)uVar10;
  uStack_101b = SUB42(uVar10,1);
  cStack_1019 = SUB41(uVar10,3);
LAB_0017990d:
  pvVar6 = get_thread_log_callback_userdata();
  (*p_Var5)(pvVar6,Error,(char *)&local_1028);
  return false;
}

Assistant:

bool analyze_ags_wmma_store(Converter::Impl &impl, const llvm::StoreInst *store)
{
	auto itr = impl.ags.coopmat_component_mapping.find(store->getOperand(0));
	if (itr == impl.ags.coopmat_component_mapping.end())
		return true;

	const auto *gep = llvm::dyn_cast<llvm::GetElementPtrInst>(store->getOperand(1));
	if (!gep)
	{
		LOGE("Trying to store a WMMA matrix without GEP.\n");
		return false;
	}

	auto *alloca = llvm::dyn_cast<llvm::AllocaInst>(gep->getOperand(0));
	if (!alloca || gep->getNumOperands() < 3)
	{
		LOGE("Trying to store WMMA to something not Alloca.\n");
		return false;
	}

	const auto *index = gep->getOperand(2);
	auto split = split_index_scale_bias(index);
	if (!split.stride)
		return false;

	auto &tracking = impl.alloca_ags_tracking[alloca];
	if (tracking.override_element_stride &&
	    tracking.override_element_stride != split.stride &&
	    split.stride != UINT32_MAX)
	{
		LOGE("Mismatch WMMA stride.\n");
		return false;
	}

	if (tracking.override_element_type && tracking.override_element_type != itr->second.type_id)
	{
		LOGE("Mismatch WMMA type.\n");
		return false;
	}

	if (split.stride == UINT32_MAX)
	{
		// Somewhat hacky, but this is the AGS assumption.
		tracking.override_element_stride = 8;

#if 0
		// This breaks in some cases.
		if (split.elem > itr->second.component)
		{
			if (tracking.override_element_stride == 0)
			{
				// We can deduce stride from this.
				tracking.override_element_stride = split.elem - itr->second.component;
			}
			else
			{
				// This isn't perfect if there are gaps in the writes, but we can assume that's not the case.
				tracking.override_element_stride =
					std::min<uint32_t>(split.elem - itr->second.component,
									   tracking.override_element_stride);
			}
		}
#endif
	}

	if (split.stride == UINT32_MAX && tracking.override_element_stride)
	{
		split.stride = tracking.override_element_stride;
		split.elem %= split.stride;
	}

	// If we have constant indices we don't know how the mapping works yet.
	if (split.elem != itr->second.component)
	{
		LOGE("Unexpected component mapping in WMMA store.\n");
		return false;
	}

	if (split.stride != UINT32_MAX)
		tracking.override_element_stride = split.stride;
	tracking.override_element_type = itr->second.type_id;
	return true;
}